

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_interpreter_primitive_loadSourceNamedMacro
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t loadSourceCall;
  sysbvm_tuple_t loadSourceNamedWithSolvedPath;
  sysbvm_tuple_t loadSourceArguments;
  sysbvm_tuple_t solveNameCall;
  sysbvm_tuple_t solveNameFunction;
  sysbvm_tuple_t solveNameArguments;
  sysbvm_tuple_t sourceDirectory;
  sysbvm_tuple_t sourcePosition;
  sysbvm_tuple_t *sourceName;
  sysbvm_tuple_t *macroContext;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  sVar1 = sysbvm_macroContext_getSourcePosition(*arguments);
  sVar2 = sysbvm_symbol_internWithCString(context,"__SourceDirectory__");
  sVar2 = sysbvm_astIdentifierReferenceNode_create(context,sVar1,sVar2);
  sVar3 = sysbvm_array_create(context,2);
  sysbvm_array_atPut(sVar3,0,sVar2);
  sysbvm_array_atPut(sVar3,1,arguments[1]);
  sVar2 = sysbvm_symbol_internWithCString(context,"FileSystem::joinPath:");
  sVar2 = sysbvm_astIdentifierReferenceNode_create(context,sVar1,sVar2);
  sVar2 = sysbvm_astUnexpandedApplicationNode_create(context,sVar1,sVar2,sVar3);
  sVar3 = sysbvm_array_create(context,1);
  sysbvm_array_atPut(sVar3,0,sVar2);
  sVar2 = sysbvm_symbol_internWithCString(context,"loadSourceNamedWithSolvedPath:");
  sVar2 = sysbvm_astIdentifierReferenceNode_create(context,sVar1,sVar2);
  sVar1 = sysbvm_astUnexpandedApplicationNode_create(context,sVar1,sVar2,sVar3);
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_interpreter_primitive_loadSourceNamedMacro(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *macroContext = &arguments[0];
    sysbvm_tuple_t *sourceName = &arguments[1];

    sysbvm_tuple_t sourcePosition = sysbvm_macroContext_getSourcePosition(*macroContext);

    sysbvm_tuple_t sourceDirectory = sysbvm_astIdentifierReferenceNode_create(context, sourcePosition, sysbvm_symbol_internWithCString(context, "__SourceDirectory__"));
    sysbvm_tuple_t solveNameArguments = sysbvm_array_create(context, 2);
    sysbvm_array_atPut(solveNameArguments, 0, sourceDirectory);
    sysbvm_array_atPut(solveNameArguments, 1, *sourceName);

    sysbvm_tuple_t solveNameFunction = sysbvm_astIdentifierReferenceNode_create(context, sourcePosition, sysbvm_symbol_internWithCString(context, "FileSystem::joinPath:"));
    sysbvm_tuple_t solveNameCall = sysbvm_astUnexpandedApplicationNode_create(context, sourcePosition, solveNameFunction, solveNameArguments);

    sysbvm_tuple_t loadSourceArguments = sysbvm_array_create(context, 1);
    sysbvm_array_atPut(loadSourceArguments, 0, solveNameCall);

    sysbvm_tuple_t loadSourceNamedWithSolvedPath = sysbvm_astIdentifierReferenceNode_create(context, sourcePosition, sysbvm_symbol_internWithCString(context, "loadSourceNamedWithSolvedPath:"));
    sysbvm_tuple_t loadSourceCall = sysbvm_astUnexpandedApplicationNode_create(context, sourcePosition, loadSourceNamedWithSolvedPath, loadSourceArguments);
    return loadSourceCall;
}